

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ClearStatTables(Parse *pParse,int iDb,char *zType,char *zName)

{
  char *pcVar1;
  Table *pTVar2;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  char *zDbName;
  int i;
  char zTab [24];
  uint local_4c;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = in_RDI->db->aDb[in_ESI].zDbSName;
  for (local_4c = 1; (int)local_4c < 5; local_4c = local_4c + 1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    sqlite3_snprintf(0x18,(char *)&local_28,"sqlite_stat%d",(ulong)local_4c);
    pTVar2 = sqlite3FindTable((sqlite3 *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),in_RDX,in_RCX);
    if (pTVar2 != (Table *)0x0) {
      sqlite3NestedParse(in_RDI,"DELETE FROM %Q.%s WHERE %s=%Q",pcVar1,&local_28,in_RDX,in_RCX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3ClearStatTables(
  Parse *pParse,         /* The parsing context */
  int iDb,               /* The database number */
  const char *zType,     /* "idx" or "tbl" */
  const char *zName      /* Name of index or table */
){
  int i;
  const char *zDbName = pParse->db->aDb[iDb].zDbSName;
  for(i=1; i<=4; i++){
    char zTab[24];
    sqlite3_snprintf(sizeof(zTab),zTab,"sqlite_stat%d",i);
    if( sqlite3FindTable(pParse->db, zTab, zDbName) ){
      sqlite3NestedParse(pParse,
        "DELETE FROM %Q.%s WHERE %s=%Q",
        zDbName, zTab, zType, zName
      );
    }
  }
}